

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2convex_hull_query.cc
# Opt level: O0

S2Cap * __thiscall
S2ConvexHullQuery::GetCapBound(S2Cap *__return_storage_ptr__,S2ConvexHullQuery *this)

{
  S2ConvexHullQuery *this_local;
  
  S2LatLngRect::GetCapBound(__return_storage_ptr__,&this->bound_);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2ConvexHullQuery::GetCapBound() {
  // We keep track of a rectangular bound rather than a spherical cap because
  // it is easy to compute a tight bound for a union of rectangles, whereas it
  // is quite difficult to compute a tight bound around a union of caps.
  // Also, polygons and polylines implement GetCapBound() in terms of
  // GetRectBound() for this same reason, so it is much better to keep track
  // of a rectangular bound as we go along and convert it at the end.
  //
  // TODO(ericv): We could compute an optimal bound by implementing Welzl's
  // algorithm.  However we would still need to have special handling of loops
  // and polygons, since if a loop spans more than 180 degrees in any
  // direction (i.e., if it contains two antipodal points), then it is not
  // enough just to bound its vertices.  In this case the only convex bounding
  // cap is S2Cap::Full(), and the only convex bounding loop is the full loop.
  return bound_.GetCapBound();
}